

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

void __thiscall icu_63::Calendar::validateFields(Calendar *this,UErrorCode *status)

{
  UErrorCode UVar1;
  ulong uVar2;
  bool bVar3;
  
  UVar1 = *status;
  if (U_ZERO_ERROR < UVar1) {
    return;
  }
  uVar2 = 0;
  do {
    if (1 < this->fStamp[uVar2]) {
      (*(this->super_UObject)._vptr_UObject[0x27])(this,uVar2 & 0xffffffff,status);
      UVar1 = *status;
    }
  } while ((UVar1 < U_ILLEGAL_ARGUMENT_ERROR) && (bVar3 = uVar2 < 0x16, uVar2 = uVar2 + 1, bVar3));
  return;
}

Assistant:

void Calendar::validateFields(UErrorCode &status) {
    for (int32_t field = 0; U_SUCCESS(status) && (field < UCAL_FIELD_COUNT); field++) {
        if (fStamp[field] >= kMinimumUserStamp) {
            validateField((UCalendarDateFields)field, status);
        }
    }
}